

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedRotaryWingAircraft.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedRotaryWingAircraft::Encode
          (GED_EnhancedRotaryWingAircraft *this,KDataStream *stream)

{
  GED_BasicRotorWingAircraft::Encode(&this->super_GED_BasicRotorWingAircraft,stream);
  KDataStream::Write(stream,(this->super_GED_BasicRotorWingAircraft).field_0x2c);
  KDataStream::Write(stream,(this->super_GED_BasicRotorWingAircraft).field_0x2d);
  KDataStream::Write(stream,(this->super_GED_BasicRotorWingAircraft).field_0x2e);
  KDataStream::Write(stream,(this->super_GED_BasicRotorWingAircraft).field_0x2f);
  return;
}

Assistant:

void GED_EnhancedRotaryWingAircraft::Encode( KDataStream & stream ) const
{
    GED_BasicRotorWingAircraft::Encode( stream );

    stream << m_ui8SupFuelStatus
           << m_ui8AirMaintStatus
           << m_ui8PriAmmun
           << m_ui8SecAmmun;
}